

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_hash.c
# Opt level: O2

void ascon_hasha_xof(uint8_t *digest,uint8_t *data,size_t digest_len,size_t data_len)

{
  ascon_hash_ctx_t ctx;
  ascon_hash_ctx_t local_58;
  
  local_58.sponge.x0 = 0x44906568b77b9832;
  local_58.sponge.x1 = 0xcd8d6cae53455532;
  local_58.sponge.x2 = 0xf7b5212756422129;
  local_58.sponge.x3 = 0x246885e1de0d225b;
  local_58.sponge.x4 = 0xa8cb5ce33449973f;
  local_58.buffer_len = '\0';
  local_58.flow_state = '\v';
  ascon_hasha_xof_update(&local_58,data,data_len);
  ascon_hasha_xof_final(&local_58,digest,digest_len);
  return;
}

Assistant:

ASCON_API void
ascon_hasha_xof(uint8_t* const digest,
                const uint8_t* const data,
                const size_t digest_len,
                const size_t data_len)
{
    ASCON_ASSERT(digest_len == 0 || digest != NULL);
    ASCON_ASSERT(data_len == 0 || data != NULL);
    ascon_hash_ctx_t ctx;
    ascon_hasha_xof_init(&ctx);
    ascon_hasha_xof_update(&ctx, data, data_len);
    ascon_hasha_xof_final(&ctx, digest, digest_len);
}